

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

ValueType __thiscall Jinx::Impl::Parser::ParseValueType(Parser *this)

{
  SymbolType SVar1;
  pointer pSVar2;
  ValueType VVar3;
  
  VVar3 = Null;
  if (this->m_error != false) {
    return Null;
  }
  pSVar2 = (this->m_currentSymbol)._M_current;
  if (pSVar2 == (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    return Null;
  }
  SVar1 = pSVar2->type;
  this->m_lastLine = pSVar2->lineNumber;
  (this->m_currentSymbol)._M_current = pSVar2 + 1;
  if ((int)SVar1 < 0x2a) {
    if (SVar1 == Boolean) {
      return Boolean;
    }
    if (SVar1 == Collection) {
      return Collection;
    }
    if (SVar1 == Coroutine) {
      return Coroutine;
    }
    goto switchD_00122481_caseD_2c;
  }
  switch(SVar1) {
  case Function:
    VVar3 = Function;
    break;
  case Guid:
    VVar3 = Guid;
    break;
  case Integer:
    VVar3 = Integer;
    break;
  case Null:
    break;
  case Number:
    VVar3 = Number;
    break;
  default:
    if (SVar1 == String) {
      return String;
    }
  case If:
  case Import:
  case Increment:
  case Is:
  case Library:
  case Loop:
  case Not:
switchD_00122481_caseD_2c:
    Error<>(this,"Unknown type");
  }
  return VVar3;
}

Assistant:

inline_t ValueType Parser::ParseValueType()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return ValueType::Null;

		auto type = m_currentSymbol->type;
		NextSymbol();
		switch (type)
		{
		case SymbolType::Number:
			return ValueType::Number;
		case SymbolType::Integer:
			return ValueType::Integer;
		case SymbolType::Boolean:
			return ValueType::Boolean;
		case SymbolType::String:
			return ValueType::String;
		case SymbolType::Null:
			return ValueType::Null;
		case SymbolType::Collection:
			return ValueType::Collection;
		case SymbolType::Function:
			return ValueType::Function;
		case SymbolType::Coroutine:
			return ValueType::Coroutine;
		case SymbolType::Guid:
			return ValueType::Guid;
		default:
			Error("Unknown type");
			break;
		}
		return ValueType::Null;
	}